

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterYs<unsigned_short>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>::
operator()(ShadedRenderer<ImPlot::GetterYs<unsigned_short>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
           *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  ushort uVar8;
  int iVar9;
  GetterYs<unsigned_short> *pGVar10;
  TransformerLogLin *pTVar11;
  ImPlotPlot *pIVar12;
  GetterYRef *pGVar13;
  ImDrawVert *pIVar14;
  ImDrawIdx *pIVar15;
  double dVar16;
  ImVec2 IVar17;
  ImPlotContext *pIVar18;
  ImPlotContext *pIVar19;
  bool bVar20;
  ImDrawIdx IVar21;
  uint uVar22;
  float fVar23;
  float fVar24;
  double dVar25;
  ImVec2 IVar26;
  float fVar27;
  ImVec2 IVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  
  pIVar18 = GImPlot;
  pGVar10 = this->Getter1;
  pTVar11 = this->Transformer;
  dVar25 = (double)(prim + 1);
  iVar9 = pGVar10->Count;
  uVar8 = *(ushort *)
           ((long)pGVar10->Ys +
           (long)(((prim + 1 + pGVar10->Offset) % iVar9 + iVar9) % iVar9) * (long)pGVar10->Stride);
  dVar16 = log10((pGVar10->XScale * dVar25 + pGVar10->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min)
  ;
  pIVar19 = GImPlot;
  pIVar12 = pIVar18->CurrentPlot;
  dVar7 = (pIVar12->XAxis).Range.Min;
  iVar9 = pTVar11->YAxis;
  fVar23 = (float)((((double)(float)(dVar16 / pIVar18->LogDenX) *
                     ((pIVar12->XAxis).Range.Max - dVar7) + dVar7) - dVar7) * pIVar18->Mx +
                  (double)pIVar18->PixelRange[iVar9].Min.x);
  fVar24 = (float)(((double)uVar8 - pIVar12->YAxis[iVar9].Range.Min) * pIVar18->My[iVar9] +
                  (double)pIVar18->PixelRange[iVar9].Min.y);
  pGVar13 = this->Getter2;
  pTVar11 = this->Transformer;
  dVar7 = pGVar13->YRef;
  dVar25 = log10((dVar25 * pGVar13->XScale + pGVar13->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min)
  ;
  pIVar12 = pIVar19->CurrentPlot;
  dVar16 = (pIVar12->XAxis).Range.Min;
  iVar9 = pTVar11->YAxis;
  fVar29 = (float)((((double)(float)(dVar25 / pIVar19->LogDenX) *
                     ((pIVar12->XAxis).Range.Max - dVar16) + dVar16) - dVar16) * pIVar19->Mx +
                  (double)pIVar19->PixelRange[iVar9].Min.x);
  fVar31 = (float)((dVar7 - pIVar12->YAxis[iVar9].Range.Min) * pIVar19->My[iVar9] +
                  (double)pIVar19->PixelRange[iVar9].Min.y);
  fVar2 = (this->P11).x;
  fVar3 = (this->P11).y;
  fVar4 = (this->P12).x;
  fVar5 = (this->P12).y;
  fVar27 = fVar3;
  if (fVar5 <= fVar3) {
    fVar27 = fVar5;
  }
  if (fVar24 <= fVar27) {
    fVar27 = fVar24;
  }
  if (fVar31 <= fVar27) {
    fVar27 = fVar31;
  }
  bVar20 = false;
  if ((fVar27 < (cull_rect->Max).y) &&
     (fVar27 = (float)(~-(uint)(fVar5 <= fVar3) & (uint)fVar5 |
                      -(uint)(fVar5 <= fVar3) & (uint)fVar3), uVar22 = -(uint)(fVar24 <= fVar27),
     fVar27 = (float)(~uVar22 & (uint)fVar24 | uVar22 & (uint)fVar27),
     uVar22 = -(uint)(fVar31 <= fVar27),
     fVar27 = (float)(~uVar22 & (uint)fVar31 | uVar22 & (uint)fVar27), pfVar1 = &(cull_rect->Min).y,
     *pfVar1 <= fVar27 && fVar27 != *pfVar1)) {
    fVar27 = fVar2;
    if (fVar4 <= fVar2) {
      fVar27 = fVar4;
    }
    if (fVar23 <= fVar27) {
      fVar27 = fVar23;
    }
    if (fVar29 <= fVar27) {
      fVar27 = fVar29;
    }
    bVar20 = false;
    if (fVar27 < (cull_rect->Max).x) {
      fVar27 = (float)(~-(uint)(fVar4 <= fVar2) & (uint)fVar4 |
                      -(uint)(fVar4 <= fVar2) & (uint)fVar2);
      uVar22 = -(uint)(fVar23 <= fVar27);
      fVar27 = (float)(~uVar22 & (uint)fVar23 | uVar22 & (uint)fVar27);
      uVar22 = -(uint)(fVar29 <= fVar27);
      fVar27 = (float)(~uVar22 & (uint)fVar29 | uVar22 & (uint)fVar27);
      bVar20 = (cull_rect->Min).x <= fVar27 && fVar27 != (cull_rect->Min).x;
    }
  }
  IVar26.y = fVar24;
  IVar26.x = fVar23;
  IVar28.y = fVar31;
  IVar28.x = fVar29;
  if (bVar20 != false) {
    fVar27 = (this->P11).y;
    fVar6 = (this->P12).y;
    fVar33 = fVar2 * fVar24 - fVar23 * fVar3;
    fVar32 = fVar4 * fVar31 - fVar29 * fVar5;
    fVar30 = (fVar2 - fVar23) * (fVar5 - fVar31) - (fVar4 - fVar29) * (fVar3 - fVar24);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14->col = this->Col;
    pIVar14[1].pos = IVar26;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[1].col = this->Col;
    IVar17.y = ((fVar5 - fVar31) * fVar33 - (fVar3 - fVar24) * fVar32) / fVar30;
    IVar17.x = (fVar33 * (fVar4 - fVar29) - (fVar2 - fVar23) * fVar32) / fVar30;
    pIVar14[2].pos = IVar17;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[2].col = this->Col;
    pIVar14[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[3].col = this->Col;
    pIVar14[4].pos = IVar28;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar14 + 5;
    uVar22 = DrawList->_VtxCurrentIdx;
    pIVar15 = DrawList->_IdxWritePtr;
    IVar21 = (ImDrawIdx)uVar22;
    *pIVar15 = IVar21;
    uVar8 = -(ushort)(fVar6 < fVar27 && fVar24 < fVar31 || fVar27 < fVar6 && fVar31 < fVar24) & 1;
    pIVar15[1] = IVar21 + uVar8 + 1;
    pIVar15[2] = IVar21 + 3;
    pIVar15[3] = IVar21 + 1;
    pIVar15[4] = (uVar8 ^ 3) + IVar21;
    pIVar15[5] = IVar21 + 4;
    DrawList->_IdxWritePtr = pIVar15 + 6;
    DrawList->_VtxCurrentIdx = uVar22 + 5;
  }
  this->P11 = IVar26;
  this->P12 = IVar28;
  return bVar20;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }